

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O0

int pollwrap_get_fd_rwx(pollwrapper *pw,int fd)

{
  uint local_20;
  uint local_1c;
  int rwx;
  int revents;
  int events;
  int fd_local;
  pollwrapper *pw_local;
  
  revents = fd;
  _events = pw;
  pollwrap_get_fd_events_revents(pw,fd,&rwx,(int *)&local_1c);
  local_20 = 0;
  if (((rwx & 1U) != 0) && ((local_1c & 0xd9) != 0)) {
    local_20 = 1;
  }
  if (((rwx & 4U) != 0) && ((local_1c & 0x30c) != 0)) {
    local_20 = local_20 | 2;
  }
  if (((rwx & 2U) != 0) && ((local_1c & 2) != 0)) {
    local_20 = local_20 | 4;
  }
  return local_20;
}

Assistant:

int pollwrap_get_fd_rwx(pollwrapper *pw, int fd)
{
    int events, revents;
    pollwrap_get_fd_events_revents(pw, fd, &events, &revents);
    int rwx = 0;
    if ((events & POLLIN) && (revents & SELECT_R_OUT))
        rwx |= SELECT_R;
    if ((events & POLLOUT) && (revents & SELECT_W_OUT))
        rwx |= SELECT_W;
    if ((events & POLLPRI) && (revents & SELECT_X_OUT))
        rwx |= SELECT_X;
    return rwx;
}